

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O3

string * __thiscall
cmCoreTryCompile::WriteSource
          (string *__return_storage_ptr__,cmCoreTryCompile *this,string *filename,string *content,
          char *command)

{
  size_type sVar1;
  _Alloc_hider _Var2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  string filepath;
  ofstream file;
  string local_2b0;
  string local_290;
  undefined1 local_270 [32];
  size_type local_250;
  pointer local_248;
  undefined8 local_240;
  char *local_238;
  undefined1 local_230 [8];
  char *local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  size_type local_210;
  pointer local_208;
  undefined8 local_200;
  char *local_1f8;
  ios_base local_138 [264];
  
  cmsys::SystemTools::GetFilenamePath((string *)local_230,filename);
  if (local_230 != (undefined1  [8])&local_220) {
    operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
  }
  if (local_228 != (char *)0x0) {
    local_230 = (undefined1  [8])strlen(command);
    local_220._M_allocated_capacity = 0x19;
    local_220._8_8_ = (long)"SOURCE_FROM_FILE given invalid filename \"" + 0x10;
    local_208 = (filename->_M_dataplus)._M_p;
    local_210 = filename->_M_string_length;
    local_200 = 1;
    local_1f8 = "\"";
    views._M_len = 4;
    views._M_array = (iterator)local_230;
    local_228 = command;
    cmCatViews_abi_cxx11_((string *)local_270,views);
    cmMakefile::IssueMessage(this->Makefile,FATAL_ERROR,(string *)local_270);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    sVar1 = local_270._16_8_;
    _Var2._M_p = (pointer)local_270._0_8_;
    if ((undefined1 *)local_270._0_8_ == local_270 + 0x10) {
      return __return_storage_ptr__;
    }
    goto LAB_0046cb88;
  }
  local_228 = (this->BinaryDirectory)._M_dataplus._M_p;
  local_230 = (undefined1  [8])(this->BinaryDirectory)._M_string_length;
  local_220._M_allocated_capacity = 1;
  local_220._8_8_ = (long)"in Json::Value::setComment(): Comments must start with /" + 0x37;
  local_208 = (filename->_M_dataplus)._M_p;
  local_210 = filename->_M_string_length;
  views_00._M_len = 3;
  views_00._M_array = (iterator)local_230;
  cmCatViews_abi_cxx11_(&local_290,views_00);
  std::ofstream::ofstream(local_230,local_290._M_dataplus._M_p,_S_out);
  if ((*(byte *)((long)&local_210 + *(long *)((long)local_230 + -0x18)) & 5) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,(content->_M_dataplus)._M_p,content->_M_string_length);
    if ((*(byte *)((long)&local_210 + *(long *)((long)local_230 + -0x18)) & 5) != 0) {
      local_270._0_8_ = strlen(command);
      local_270._16_8_ = 0x12;
      local_270._24_8_ = " failed to write \"";
      local_248 = (filename->_M_dataplus)._M_p;
      local_250 = filename->_M_string_length;
      local_240 = 1;
      local_238 = "\"";
      views_02._M_len = 4;
      views_02._M_array = (iterator)local_270;
      local_270._8_8_ = command;
      cmCatViews_abi_cxx11_(&local_2b0,views_02);
      cmMakefile::IssueMessage(this->Makefile,FATAL_ERROR,&local_2b0);
      goto LAB_0046cabb;
    }
    std::ofstream::close();
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p == &local_290.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,local_290.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_290.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_290._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,local_290.field_2._M_local_buf[0])
      ;
    }
    __return_storage_ptr__->_M_string_length = local_290._M_string_length;
    local_290._M_string_length = 0;
    local_290.field_2._M_local_buf[0] = '\0';
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_270._0_8_ = strlen(command);
    local_270._16_8_ = 0x11;
    local_270._24_8_ = " failed to open \"";
    local_248 = (filename->_M_dataplus)._M_p;
    local_250 = filename->_M_string_length;
    local_240 = 0xd;
    local_238 = "\" for writing";
    views_01._M_len = 4;
    views_01._M_array = (iterator)local_270;
    local_270._8_8_ = command;
    cmCatViews_abi_cxx11_(&local_2b0,views_01);
    cmMakefile::IssueMessage(this->Makefile,FATAL_ERROR,&local_2b0);
LAB_0046cabb:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
  }
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _EVP_PKEY_get_bn_param;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p == &local_290.field_2) {
    return __return_storage_ptr__;
  }
  sVar1 = CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,local_290.field_2._M_local_buf[0]);
  _Var2._M_p = local_290._M_dataplus._M_p;
LAB_0046cb88:
  operator_delete(_Var2._M_p,sVar1 + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCoreTryCompile::WriteSource(std::string const& filename,
                                          std::string const& content,
                                          char const* command) const
{
  if (!cmSystemTools::GetFilenamePath(filename).empty()) {
    const auto& msg =
      cmStrCat(command, " given invalid filename \"", filename, "\"");
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, msg);
    return {};
  }

  auto filepath = cmStrCat(this->BinaryDirectory, "/", filename);
  cmsys::ofstream file{ filepath.c_str(), std::ios::out };
  if (!file) {
    const auto& msg =
      cmStrCat(command, " failed to open \"", filename, "\" for writing");
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, msg);
    return {};
  }

  file << content;
  if (!file) {
    const auto& msg = cmStrCat(command, " failed to write \"", filename, "\"");
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, msg);
    return {};
  }

  file.close();
  return filepath;
}